

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O0

void tcu::writeXmlCaselist(TestHierarchyIterator *iter,qpXmlWriter *writer)

{
  deBool dVar1;
  TestNodeType TVar2;
  State SVar3;
  TestNode *pTVar4;
  char *pcVar5;
  Exception *pEVar6;
  long lVar7;
  allocator<char> local_281;
  string local_280;
  undefined1 local_25a;
  allocator<char> local_259;
  string local_258;
  undefined1 local_232;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [16];
  char *local_200;
  char *pcStack_1f8;
  undefined1 local_1f0 [16];
  char *local_1e0;
  char *pcStack_1d8;
  undefined1 local_1d0 [16];
  char *local_1c0;
  char *pcStack_1b8;
  int local_1ac;
  undefined1 local_1a8 [4];
  int numAttribs_1;
  qpXmlAttribute attribs_1 [3];
  string local_140 [8];
  string description;
  string local_118 [8];
  string caseName;
  bool isEnter;
  TestNodeType nodeType;
  TestNode *node_1;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [16];
  char *local_a0;
  char *local_98;
  undefined1 local_90 [16];
  char *local_80;
  char *local_78;
  int local_6c;
  undefined1 local_68 [4];
  int numAttribs;
  qpXmlAttribute attribs [2];
  TestNode *node;
  qpXmlWriter *writer_local;
  TestHierarchyIterator *iter_local;
  
  pTVar4 = TestHierarchyIterator::getNode(iter);
  local_6c = 0;
  pcVar5 = TestNode::getName(pTVar4);
  qpSetStringAttrib((qpXmlAttribute *)local_90,"PackageName",pcVar5);
  lVar7 = (long)local_6c;
  *(undefined8 *)(local_68 + lVar7 * 0x20) = local_90._0_8_;
  attribs[lVar7].name = (char *)local_90._8_8_;
  *(char **)&attribs[lVar7].type = local_80;
  attribs[lVar7].stringValue = local_78;
  local_6c = local_6c + 1;
  pcVar5 = TestNode::getDescription(pTVar4);
  qpSetStringAttrib((qpXmlAttribute *)local_b0,"Description",pcVar5);
  lVar7 = (long)local_6c;
  *(undefined8 *)(local_68 + lVar7 * 0x20) = local_b0._0_8_;
  attribs[lVar7].name = (char *)local_b0._8_8_;
  *(char **)&attribs[lVar7].type = local_a0;
  attribs[lVar7].stringValue = local_98;
  local_6c = local_6c + 1;
  dVar1 = qpXmlWriter_startDocument(writer);
  if ((dVar1 == 0) ||
     (dVar1 = qpXmlWriter_startElement(writer,"TestCaseList",local_6c,(qpXmlAttribute *)local_68),
     dVar1 == 0)) {
    pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Failed to start XML document",&local_d1);
    Exception::Exception(pEVar6,&local_d0);
    __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
  }
  TestHierarchyIterator::next(iter);
  while( true ) {
    pTVar4 = TestHierarchyIterator::getNode(iter);
    TVar2 = TestNode::getNodeType(pTVar4);
    if (TVar2 == NODETYPE_PACKAGE) break;
    pTVar4 = TestHierarchyIterator::getNode(iter);
    caseName.field_2._12_4_ = TestNode::getNodeType(pTVar4);
    SVar3 = TestHierarchyIterator::getState(iter);
    caseName.field_2._M_local_buf[0xb] = SVar3 == STATE_ENTER_NODE;
    if ((bool)caseName.field_2._M_local_buf[0xb]) {
      pcVar5 = TestNode::getName(pTVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_118,pcVar5,(allocator<char> *)(description.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
      pcVar5 = TestNode::getDescription(pTVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,pcVar5,(allocator<char> *)((long)&attribs_1[2].boolValue + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&attribs_1[2].boolValue + 3));
      local_1ac = 0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      qpSetStringAttrib((qpXmlAttribute *)local_1d0,"Name",pcVar5);
      lVar7 = (long)local_1ac;
      local_1ac = local_1ac + 1;
      *(char **)&attribs_1[lVar7].type = local_1c0;
      attribs_1[lVar7].stringValue = pcStack_1b8;
      *(undefined8 *)(local_1a8 + lVar7 * 0x20) = local_1d0._0_8_;
      attribs_1[lVar7].name = (char *)local_1d0._8_8_;
      pcVar5 = getNodeTypeName(caseName.field_2._12_4_);
      qpSetStringAttrib((qpXmlAttribute *)local_1f0,"CaseType",pcVar5);
      lVar7 = (long)local_1ac;
      local_1ac = local_1ac + 1;
      *(char **)&attribs_1[lVar7].type = local_1e0;
      attribs_1[lVar7].stringValue = pcStack_1d8;
      *(undefined8 *)(local_1a8 + lVar7 * 0x20) = local_1f0._0_8_;
      attribs_1[lVar7].name = (char *)local_1f0._8_8_;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      qpSetStringAttrib((qpXmlAttribute *)local_210,"Description",pcVar5);
      lVar7 = (long)local_1ac;
      local_1ac = local_1ac + 1;
      *(char **)&attribs_1[lVar7].type = local_200;
      attribs_1[lVar7].stringValue = pcStack_1f8;
      *(undefined8 *)(local_1a8 + lVar7 * 0x20) = local_210._0_8_;
      attribs_1[lVar7].name = (char *)local_210._8_8_;
      dVar1 = qpXmlWriter_startElement(writer,"TestCase",local_1ac,(qpXmlAttribute *)local_1a8);
      if (dVar1 == 0) {
        local_232 = 1;
        pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"Writing to case list file failed",&local_231);
        Exception::Exception(pEVar6,&local_230);
        local_232 = 0;
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      }
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_118);
    }
    else {
      dVar1 = qpXmlWriter_endElement(writer,"TestCase");
      if (dVar1 == 0) {
        local_25a = 1;
        pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"Writing to case list file failed",&local_259);
        Exception::Exception(pEVar6,&local_258);
        local_25a = 0;
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      }
    }
    TestHierarchyIterator::next(iter);
  }
  dVar1 = qpXmlWriter_endElement(writer,"TestCaseList");
  if ((dVar1 != 0) && (dVar1 = qpXmlWriter_endDocument(writer), dVar1 != 0)) {
    return;
  }
  pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Failed to terminate XML document",&local_281);
  Exception::Exception(pEVar6,&local_280);
  __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void writeXmlCaselist (TestHierarchyIterator& iter, qpXmlWriter* writer)
{
	DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
			  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);

	{
		const TestNode* node		= iter.getNode();
		qpXmlAttribute	attribs[2];
		int				numAttribs	= 0;
		attribs[numAttribs++] = qpSetStringAttrib("PackageName", node->getName());
		attribs[numAttribs++] = qpSetStringAttrib("Description", node->getDescription());
		DE_ASSERT(numAttribs <= DE_LENGTH_OF_ARRAY(attribs));

		if (!qpXmlWriter_startDocument(writer) ||
			!qpXmlWriter_startElement(writer, "TestCaseList", numAttribs, attribs))
			throw Exception("Failed to start XML document");
	}

	iter.next();

	while (iter.getNode()->getNodeType() != NODETYPE_PACKAGE)
	{
		const TestNode* const	node		= iter.getNode();
		const TestNodeType		nodeType	= node->getNodeType();
		const bool				isEnter		= iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE;

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE ||
				  iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE);
		{
			if (isEnter)
			{
				const string	caseName	= node->getName();
				const string	description	= node->getDescription();
				qpXmlAttribute	attribs[3];
				int				numAttribs = 0;

				attribs[numAttribs++] = qpSetStringAttrib("Name",			caseName.c_str());
				attribs[numAttribs++] = qpSetStringAttrib("CaseType",		getNodeTypeName(nodeType));
				attribs[numAttribs++] = qpSetStringAttrib("Description",	description.c_str());
				DE_ASSERT(numAttribs <= DE_LENGTH_OF_ARRAY(attribs));

				if (!qpXmlWriter_startElement(writer, "TestCase", numAttribs, attribs))
					throw Exception("Writing to case list file failed");
			}
			else
			{
				if (!qpXmlWriter_endElement(writer, "TestCase"))
					throw tcu::Exception("Writing to case list file failed");
			}
		}

		iter.next();
	}

	// This could be done in catch, but the file is corrupt at that point anyways.
	if (!qpXmlWriter_endElement(writer, "TestCaseList") ||
		!qpXmlWriter_endDocument(writer))
		throw Exception("Failed to terminate XML document");
}